

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

int lws_mqtt_client_send_publish
              (lws *wsi,lws_mqtt_publish_param_t *pub,void *buf,uint32_t len,int is_complete)

{
  undefined1 *puVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  undefined2 uVar5;
  lws_mqtt_qos_levels_t lVar6;
  lws_context *plVar7;
  _lws_mqtt_related *p_Var8;
  int iVar9;
  int iVar10;
  lws *wsi_00;
  uint8_t *puVar11;
  uint16_t u;
  uint value;
  byte *buf_00;
  char *format;
  uchar *puVar12;
  bool bVar13;
  lws_mqtt_str_t mqtt_vh_payload;
  lws_mqtt_str_t local_40;
  
  plVar7 = wsi->context;
  cVar2 = wsi->tsi;
  puVar12 = plVar7->pt[cVar2].serv_buf;
  wsi_00 = lws_get_network_wsi(wsi);
  if (pub->topic == (char *)0x0) {
    __assert_fail("pub->topic",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x64e,
                  "int lws_mqtt_client_send_publish(struct lws *, lws_mqtt_publish_param_t *, const void *, uint32_t, int)"
                 );
  }
  _lws_log(0x10,"%s: len = %d, is_complete = %d\n","lws_mqtt_client_send_publish",(ulong)len,
           (ulong)(uint)is_complete);
  if ((short)wsi->wsistate != 0x119) {
    _lws_log(1,"%s: wsi %p: unknown state 0x%x\n","lws_mqtt_client_send_publish",wsi);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x656,
                  "int lws_mqtt_client_send_publish(struct lws *, lws_mqtt_publish_param_t *, const void *, uint32_t, int)"
                 );
  }
  bVar3 = wsi->mqtt->field_0xfe;
  if ((bVar3 & 4) == 0) {
    buf_00 = puVar12 + 0x10;
    lVar6 = pub->qos;
    if (QOS2 < lVar6) {
      _lws_log(1,"%s: Unsupport QoS level 0x%x\n","lws_mqtt_fill_fixed_header",(ulong)lVar6);
      format = "%s: Failed to fill fixed header\n";
      goto LAB_0011a504;
    }
    *buf_00 = (char)lVar6 * '\x02' | 0x30;
    uVar4 = pub->topic_len;
    bVar13 = pub->qos != QOS0;
    value = (uint)uVar4 + (uint)bVar13 * 2 + 2 + pub->payload_len;
    _lws_log(0x10,"%s: Remaining len = %d\n","lws_mqtt_client_send_publish",(ulong)value);
    if (wsi->context->pt_serv_buf_size - 0x10 <= (uint)uVar4 + (uint)bVar13 * 2 + len + 2) {
      format = "%s: Payload is too big\n";
      goto LAB_0011a504;
    }
    puVar12 = puVar12 + 0x11;
    iVar10 = lws_mqtt_vbi_encode(value,puVar12);
    lws_ser_wu16be(puVar12 + iVar10,pub->topic_len);
    lws_mqtt_str_init(&local_40,puVar12 + (long)iVar10 + 2,
                      (short)*(undefined4 *)&pub->topic_len + (short)len +
                      (ushort)(pub->qos != QOS0) * 2,'\0');
    puVar11 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
    lws_strncpy((char *)puVar11,pub->topic,(ulong)pub->topic_len + 1);
    iVar10 = lws_mqtt_str_advance(&local_40,(uint)pub->topic_len);
    if (iVar10 != 0) {
      format = "%s: a\n";
      goto LAB_0011a504;
    }
    if (pub->qos != QOS0) {
      puVar11 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
      p_Var8 = wsi->mqtt;
      uVar5 = p_Var8->pkt_id;
      u = uVar5 + 1;
      p_Var8->pkt_id = u;
      pub->packet_id = u;
      p_Var8->ack_pkt_id = u;
      lws_ser_wu16be(puVar11,u);
      iVar10 = lws_mqtt_str_advance(&local_40,2);
      if (iVar10 != 0) {
        format = "%s: b\n";
        goto LAB_0011a504;
      }
    }
    iVar10 = (int)puVar11;
    if ((len != 0) && (pub->payload_len != 0)) {
      puVar11 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
      memcpy(puVar11,buf,(ulong)len);
      iVar10 = lws_mqtt_str_advance(&local_40,len);
      if (iVar10 != 0) {
        return 1;
      }
      puVar11 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
      iVar10 = (int)puVar11;
    }
    if (is_complete == 0) {
      puVar1 = &wsi->mqtt->field_0xfe;
      *puVar1 = *puVar1 | 4;
      puVar1 = &wsi_00->mqtt->field_0xfe;
      *puVar1 = *puVar1 | 4;
    }
  }
  else {
    iVar10 = len + (int)buf;
    buf_00 = (byte *)buf;
    if (is_complete != 0) {
      wsi->mqtt->field_0xfe = bVar3 & 0xfb;
    }
  }
  iVar10 = iVar10 - (int)buf_00;
  iVar9 = lws_write(wsi_00,buf_00,(long)iVar10,LWS_WRITE_BINARY);
  if (iVar9 != iVar10) {
    format = "%s: write failed\n";
LAB_0011a504:
    _lws_log(1,format,"lws_mqtt_client_send_publish");
    return 1;
  }
  if (is_complete == 0) {
    lws_callback_on_writable(wsi);
  }
  else {
    puVar1 = &wsi_00->mqtt->field_0xfe;
    *puVar1 = *puVar1 & 0xfb;
    puVar1 = &wsi->mqtt->field_0xfe;
    *puVar1 = *puVar1 & 0xfb;
    if (pub->qos != QOS0) {
      puVar1 = &wsi->mqtt->field_0xfe;
      *puVar1 = *puVar1 | 0x40;
    }
    if (pub->qos == QOS0) {
      iVar10 = (*wsi->protocol->callback)(wsi,LWS_CALLBACK_MQTT_ACK,wsi->user_space,(void *)0x0,0);
      if (iVar10 == 0) {
        return 0;
      }
      format = "%s: ACK callback exited\n";
      goto LAB_0011a504;
    }
    p_Var8 = wsi->mqtt;
    (p_Var8->sul_qos1_puback_wait).cb = lws_mqtt_publish_resend;
    __lws_sul_insert(&plVar7->pt[cVar2].pt_sul_owner,&p_Var8->sul_qos1_puback_wait,3000000);
  }
  return 0;
}

Assistant:

int
lws_mqtt_client_send_publish(struct lws *wsi, lws_mqtt_publish_param_t *pub,
			     const void *buf, uint32_t len, int is_complete)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *b = (uint8_t *)pt->serv_buf, *start, *p;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	lws_mqtt_str_t mqtt_vh_payload;
	uint32_t vh_len, rem_len;

	assert(pub->topic);

	lwsl_debug("%s: len = %d, is_complete = %d\n",
		   __func__, (int)len, (int)is_complete);

	if (lwsi_state(wsi) != LRS_ESTABLISHED) {
		lwsl_err("%s: wsi %p: unknown state 0x%x\n", __func__, wsi,
			 lwsi_state(wsi));
		assert(0);
		return 1;
	}

	if (wsi->mqtt->inside_payload) {
		/*
		 * Headers are filled, we are sending
		 * the payload - a buffer with LWS_PRE
		 * in front it.
		 */
		start = (uint8_t *)buf;
		p = start + len;
		if (is_complete)
			wsi->mqtt->inside_payload = 0;
		goto do_write;
	}

	start = b + LWS_PRE;
	p = start;
	/*
	 * Fill headers and the first chunk of the
	 * payload (if any)
	 */
	if (lws_mqtt_fill_fixed_header(p++, LMQCP_PUBLISH,
				       0, pub->qos, 0)) {
		lwsl_err("%s: Failed to fill fixed header\n", __func__);
		return 1;
	}

	/*
	 * Topic len field + Topic len + Packet ID
	 * (for QOS>0) + Payload len
	 */
	vh_len = 2 + pub->topic_len + ((pub->qos) ? 2 : 0);
	rem_len = vh_len + pub->payload_len;
	lwsl_debug("%s: Remaining len = %d\n", __func__, (int) rem_len);

	/* Will the chunk of payload fit? */
	if ((vh_len + len) >=
	    (wsi->context->pt_serv_buf_size - LWS_PRE)) {
		lwsl_err("%s: Payload is too big\n", __func__);
		return 1;
	}

	p += lws_mqtt_vbi_encode(rem_len, p);

	/* Topic's Len */
	lws_ser_wu16be(p, pub->topic_len);
	p += 2;

	/*
	 * Init lws_mqtt_str for "MQTT Variable
	 * Headers + payload" (only the supplied
	 * chuncked payload)
	 */
	lws_mqtt_str_init(&mqtt_vh_payload, (uint8_t *)p,
			  (pub->topic_len + ((pub->qos) ? 2 : 0) + len),
			  0);

	p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
	lws_strncpy((char *)p, pub->topic, (size_t)pub->topic_len+1);
	if (lws_mqtt_str_advance(&mqtt_vh_payload, pub->topic_len)) {
		lwsl_err("%s: a\n", __func__);
		return 1;
	}

	/* Packet ID */
	if (pub->qos != QOS0) {
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		wsi->mqtt->ack_pkt_id = pub->packet_id = ++wsi->mqtt->pkt_id;
		lws_ser_wu16be(p, pub->packet_id);
		if (lws_mqtt_str_advance(&mqtt_vh_payload, 2)) {
			lwsl_err("%s: b\n", __func__);
			return 1;
		}
	}
	/*
	 * A non-empty Payload is expected and a chunk
	 * is present
	 */
	if (pub->payload_len && len) {
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		memcpy(p, buf, len);
		if (lws_mqtt_str_advance(&mqtt_vh_payload, len))
			return 1;
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
	}

	if (!is_complete)
		nwsi->mqtt->inside_payload = wsi->mqtt->inside_payload = 1;

do_write:

	// lwsl_hexdump_err(start, lws_ptr_diff(p, start));

	if (lws_write(nwsi, start, lws_ptr_diff(p, start), LWS_WRITE_BINARY) !=
			lws_ptr_diff(p, start)) {
		lwsl_err("%s: write failed\n", __func__);
		return 1;
	}

	if (!is_complete) {
		/* still some more chunks to come... */
		lws_callback_on_writable(wsi);

		return 0;
	}

	wsi->mqtt->inside_payload = nwsi->mqtt->inside_payload = 0;

	if (pub->qos != QOS0)
		wsi->mqtt->unacked_publish = 1;

	/* this was the last part of the publish message */

	if (pub->qos == QOS0) {
		/*
		 * There won't be any real PUBACK, act like we got one
		 * so the user callback logic is the same for QoS0 or
		 * QoS1
		 */
		if (wsi->protocol->callback(wsi, LWS_CALLBACK_MQTT_ACK,
					    wsi->user_space, NULL, 0)) {
			lwsl_err("%s: ACK callback exited\n", __func__);
			return 1;
		}

		return 0;
	}

	/* For QoS1, if no PUBACK coming after 3s, we must RETRY the publish */

	wsi->mqtt->sul_qos1_puback_wait.cb = lws_mqtt_publish_resend;
	__lws_sul_insert(&pt->pt_sul_owner, &wsi->mqtt->sul_qos1_puback_wait,
			 3 * LWS_USEC_PER_SEC);

	return 0;
}